

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wav_ds_get_cursor(ma_data_source *pDataSource,ma_uint64 *pCursor)

{
  ma_result mVar1;
  ma_uint64 *in_RSI;
  ma_wav *in_RDI;
  
  mVar1 = ma_wav_get_cursor_in_pcm_frames(in_RDI,in_RSI);
  return mVar1;
}

Assistant:

static ma_result ma_wav_ds_get_cursor(ma_data_source* pDataSource, ma_uint64* pCursor)
{
    return ma_wav_get_cursor_in_pcm_frames((ma_wav*)pDataSource, pCursor);
}